

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::
GetResolvedFeatures<google::protobuf::FieldDescriptor>
          (string *__return_storage_ptr__,Generator *this,FieldDescriptor *descriptor)

{
  FileDescriptor *this_00;
  ushort *puVar1;
  FieldDescriptor *this_01;
  char *pcVar2;
  pointer ppFVar3;
  bool bVar4;
  int number;
  Descriptor *pDVar5;
  Message *this_02;
  MessageLite *this_03;
  EnumDescriptor *this_04;
  EnumValueDescriptor *pEVar6;
  LogMessage *pLVar7;
  AlphaNum *in_R8;
  pointer ppFVar8;
  string_view name;
  string_view data;
  string_view v;
  string_view v_00;
  string_view v_01;
  Metadata MVar9;
  string_view separator;
  string local_190;
  long *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_args;
  string local_128;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  FormatSpec<std::__cxx11::basic_string<char>,_std::basic_string_view<char>_> local_e0;
  string local_d0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  bVar4 = GeneratingDescriptorProto(this);
  if (bVar4) {
    this_00 = this->file_;
    pDVar5 = FeatureSet::GetDescriptor();
    puVar1 = (ushort *)(pDVar5->all_names_).payload_;
    name._M_len = (ulong)*puVar1;
    name._M_str = (char *)((long)puVar1 + ~name._M_len);
    pDVar5 = FileDescriptor::FindMessageTypeByName(this_00,name);
    if (pDVar5 == (Descriptor *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                 ,0x1d0,"feature_set != nullptr");
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_190,
                          (char (*) [44])"Malformed descriptor.proto doesn\'t contain ");
      pDVar5 = FeatureSet::GetDescriptor();
      pcVar2 = (pDVar5->all_names_).payload_;
      v_01._M_len = (ulong)*(ushort *)(pcVar2 + 2);
      v_01._M_str = pcVar2 + ~v_01._M_len;
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,v_01);
LAB_0019bec7:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_190);
    }
    std::make_unique<google::protobuf::DynamicMessageFactory>();
    this_02 = (Message *)(**(code **)(*local_160 + 0x10))(local_160,pDVar5);
    this_03 = &Message::New(this_02)->super_MessageLite;
    MessageLite::SerializeAsString_abi_cxx11_
              (&local_190,(MessageLite *)descriptor->merged_features_);
    data._M_str = local_190._M_dataplus._M_p;
    data._M_len = local_190._M_string_length;
    MessageLite::ParseFromString(this_03,data);
    std::__cxx11::string::~string((string *)&local_190);
    feature_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    feature_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    feature_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MVar9 = Message::GetMetadata((Message *)this_03);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Reflection::ListFields(MVar9.reflection,(Message *)this_03,&fields);
    ppFVar3 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar8 = fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar3;
        ppFVar8 = ppFVar8 + 1) {
      this_01 = *ppFVar8;
      if (this_01->type_ == '\x0e') {
        if ((this_01->options_->field_0)._impl_.retention_ != 2) {
          this_04 = FieldDescriptor::enum_type(this_01);
          number = Reflection::GetEnumValue(MVar9.reflection,(Message *)this_03,this_01);
          pEVar6 = EnumDescriptor::FindValueByNumber(this_04,number);
          puVar1 = (ushort *)(this_01->all_names_).payload_;
          local_190._M_dataplus._M_p = (pointer)(ulong)*puVar1;
          local_190._M_string_length = ~(ulong)local_190._M_dataplus._M_p + (long)puVar1;
          local_80.piece_ = absl::lts_20250127::NullSafeStringView("=");
          local_e0.super_type.spec_.data_ = "%s.values_by_name[\"%s\"].number";
          local_e0.super_type.spec_.size_ = 0x1e;
          ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_50,this,this_04);
          local_f0._M_str = (pEVar6->all_names_->_M_dataplus)._M_p;
          local_f0._M_len = pEVar6->all_names_->_M_string_length;
          absl::lts_20250127::
          StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    (&local_d0,&local_e0,&local_50,&local_f0);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_128,(lts_20250127 *)&local_190,&local_80,&local_b0,in_R8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &feature_args,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        if ((this_01->field_0x1 & 8) == 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_190,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                     ,0x1e3,"field->is_extension()");
          pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)&local_190,
                              (char (*) [44])"Unsupported non-enum global feature found: ");
          pcVar2 = (this_01->all_names_).payload_;
          v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
          v._M_str = pcVar2 + ~v._M_len;
          absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,v);
          goto LAB_0019bec7;
        }
        if (this_01->number_ == 0x3eb) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_190,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                     ,0x1e7,"field->number() != 1003");
          pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)&local_190,
                              (char (*) [44])"Unsupported python-specific feature found: ");
          pcVar2 = (this_01->all_names_).payload_;
          v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
          v_00._M_str = pcVar2 + ~v_00._M_len;
          absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,v_00);
          goto LAB_0019bec7;
        }
      }
    }
    local_190._0_16_ = absl::lts_20250127::NullSafeStringView("_ResolvedFeatures(");
    separator._M_str = (char *)in_R8;
    separator._M_len = (size_t)",";
    absl::lts_20250127::strings_internal::
    JoinRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_128,(strings_internal *)&feature_args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1,separator);
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView(")");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_190,&local_80,&local_b0,in_R8);
    std::__cxx11::string::~string((string *)&local_128);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&feature_args);
    (*this_03->_vptr_MessageLite[1])();
    if (local_160 != (long *)0x0) {
      (**(code **)(*local_160 + 8))();
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None",(allocator<char> *)&local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GetResolvedFeatures(
    const DescriptorT& descriptor) const {
  if (!GeneratingDescriptorProto()) {
    // Everything but descriptor.proto can handle proper feature resolution.
    return "None";
  }

  // Load the resolved features from our pool.
  const Descriptor* feature_set =
      file_->FindMessageTypeByName(FeatureSet::GetDescriptor()->name());
  ABSL_CHECK(feature_set != nullptr)
      << "Malformed descriptor.proto doesn't contain "
      << FeatureSet::GetDescriptor()->full_name();
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  auto features =
      absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
  features->ParseFromString(
      GetResolvedSourceFeatures(descriptor).SerializeAsString());

  // Collect all of the resolved features.
  std::vector<std::string> feature_args;
  const Reflection* reflection = features->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*features, &fields);
  for (const auto* field : fields) {
    // Assume these are all enums.  If we add non-enum global features or any
    // python-specific features, we will need to come back and improve this
    // logic.
    if (field->type() != FieldDescriptor::TYPE_ENUM) {
      ABSL_CHECK(field->is_extension())
          << "Unsupported non-enum global feature found: "
          << field->full_name();
      // Placeholder for python-specific features.
      ABSL_CHECK(field->number() != 1003)
          << "Unsupported python-specific feature found: "
          << field->full_name();
      // Skip any non-python language-specific features.
      continue;
    }
    if (field->options().retention() == FieldOptions::RETENTION_SOURCE) {
      // Skip any source-retention features.
      continue;
    }
    const EnumDescriptor* enm = field->enum_type();
    const EnumValueDescriptor* value =
        enm->FindValueByNumber(reflection->GetEnumValue(*features, field));

    feature_args.emplace_back(absl::StrCat(
        field->name(), "=",
        absl::StrFormat("%s.values_by_name[\"%s\"].number",
                        ModuleLevelDescriptorName(*enm), value->name())));
  }
  return absl::StrCat("_ResolvedFeatures(", absl::StrJoin(feature_args, ","),
                      ")");
}